

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void set_free_content(lyxp_set *set)

{
  lyxp_set_type lVar1;
  
  if (set != (lyxp_set *)0x0) {
    lVar1 = set->type;
    if ((lVar1 == LYXP_SET_STRING) || (lVar1 == LYXP_SET_SNODE_SET)) {
      free((set->val).nodes);
    }
    else if (lVar1 == LYXP_SET_NODE_SET) {
      free((set->val).nodes);
      lyht_free(set->ht);
      set->ht = (hash_table *)0x0;
    }
    set->type = LYXP_SET_EMPTY;
  }
  return;
}

Assistant:

static void
set_free_content(struct lyxp_set *set)
{
    if (!set) {
        return;
    }

    if (set->type == LYXP_SET_NODE_SET) {
        free(set->val.nodes);
#ifdef LY_ENABLED_CACHE
        lyht_free(set->ht);
        set->ht = NULL;
#endif
    } else if (set->type == LYXP_SET_SNODE_SET) {
        free(set->val.snodes);
    } else if (set->type == LYXP_SET_STRING) {
        free(set->val.str);
    }
    set->type = LYXP_SET_EMPTY;
}